

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::XFileParser::XFileParser(XFileParser *this,vector<char,_std::allocator<char>_> *pBuffer)

{
  char **ppcVar1;
  char *__s1;
  ushort uVar2;
  char *__s1_00;
  Node *pNode;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  ostream *poVar9;
  ushort *puVar10;
  Logger *this_00;
  Scene *pSVar11;
  DeadlyImportError *pDVar12;
  bool bVar13;
  Bytef *pBVar14;
  allocator local_1e9;
  string local_1e8;
  vector<char,_std::allocator<char>_> uncompressed;
  z_stream stream;
  
  this->mBinaryNumCount = 0;
  this->mScene = (Scene *)0x0;
  this->mMajorVersion = 0;
  this->mMinorVersion = 0;
  this->mIsBinaryFormat = false;
  this->mP = (char *)0x0;
  this->mEnd = (char *)0x0;
  this->mLineNumber = 0;
  uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __s1_00 = (pBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this->mP = __s1_00;
  this->mEnd = (pBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1;
  iVar4 = strncmp(__s1_00,"xof ",4);
  if (iVar4 != 0) {
    pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&stream,"Header mismatch, file is not an XFile.",(allocator *)&local_1e8);
    DeadlyImportError::DeadlyImportError(pDVar12,(string *)&stream);
    __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppcVar1 = &this->mP;
  this->mMajorVersion = __s1_00[5] + -0x210 + __s1_00[4] * 10;
  this->mMinorVersion = __s1_00[7] + -0x210 + __s1_00[6] * 10;
  __s1 = __s1_00 + 8;
  iVar5 = strncmp(__s1,"txt ",4);
  iVar4 = 1;
  if (iVar5 == 0) {
    bVar13 = false;
  }
  else {
    iVar5 = strncmp(__s1,"bin ",4);
    if (iVar5 != 0) {
      iVar5 = strncmp(__s1,"tzip",4);
      if (iVar5 == 0) {
        bVar3 = true;
        bVar13 = false;
      }
      else {
        iVar5 = strncmp(__s1,"bzip",4);
        bVar13 = true;
        bVar3 = true;
        iVar4 = 0;
        if (iVar5 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
          std::operator<<((ostream *)&stream,"Unsupported xfile format \'");
          pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &stream,*ppcVar1 + 8);
          pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar8,*ppcVar1 + 9);
          pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar8,*ppcVar1 + 10);
          poVar9 = (ostream *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar8,*ppcVar1 + 0xb);
          std::operator<<(poVar9,"\'");
          std::__cxx11::stringbuf::str();
          ThrowException(this,&local_1e8);
        }
      }
      goto LAB_0053a2bf;
    }
    bVar13 = true;
    iVar4 = 0;
  }
  bVar3 = false;
LAB_0053a2bf:
  this->mIsBinaryFormat = bVar13;
  iVar6 = __s1_00[0xe] * 10 + __s1_00[0xd] * 100 + __s1_00[0xc] * 1000;
  iVar5 = iVar6 + __s1_00[0xf];
  uVar7 = (iVar6 + __s1_00[0xf]) - 0xd050;
  this->mBinaryFloatSize = uVar7;
  if ((iVar5 != 0xd070) && (iVar5 != 0xd090)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
    std::operator<<((ostream *)&stream,"Unknown float size ");
    poVar9 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&stream
                        ,&this->mBinaryFloatSize);
    std::operator<<(poVar9," specified in xfile header.");
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1e8);
  }
  this->mBinaryFloatSize = uVar7 >> 3;
  *ppcVar1 = __s1_00 + 0x10;
  if (bVar3) {
    stream.opaque = (voidpf)0x0;
    stream.zalloc = dummy_alloc;
    stream.zfree = dummy_free;
    stream.data_type = iVar4;
    inflateInit2_(&stream,0xfffffffffffffff1,"1.2.11",0x70);
    puVar10 = (ushort *)(this->mP + 6);
    this->mP = (char *)puVar10;
    uVar7 = 1;
    for (; (char *)((long)puVar10 + 3U) < this->mEnd;
        puVar10 = (ushort *)((long)puVar10 + (ulong)*puVar10 + 4)) {
      if (0x8011 < (ulong)*puVar10) {
        pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_1e8,"X: Invalid offset to next MSZIP compressed block",
                   &local_1e9);
        DeadlyImportError::DeadlyImportError(pDVar12,&local_1e8);
        __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (puVar10[1] != 0x4b43) {
        pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_1e8,"X: Unsupported compressed format, expected MSZIP header",
                   &local_1e9);
        DeadlyImportError::DeadlyImportError(pDVar12,&local_1e8);
        __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar7 = uVar7 + 0x8012;
    }
    std::vector<char,_std::allocator<char>_>::resize(&uncompressed,(ulong)uVar7);
    puVar10 = (ushort *)*ppcVar1;
    pBVar14 = (Bytef *)uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    while( true ) {
      if (this->mEnd <= (char *)((long)puVar10 + 3U)) break;
      uVar2 = *puVar10;
      *ppcVar1 = (char *)(puVar10 + 2);
      if (this->mEnd + 2 < (char *)((long)puVar10 + (ulong)uVar2 + 4)) {
        pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_1e8,"X: Unexpected EOF in compressed chunk",&local_1e9);
        DeadlyImportError::DeadlyImportError(pDVar12,&local_1e8);
        __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      stream.avail_in = (uInt)uVar2;
      stream.avail_out = 0x8012;
      stream.next_in = (Bytef *)(puVar10 + 2);
      stream.next_out = pBVar14;
      uVar7 = inflate(&stream,2);
      if (1 < uVar7) {
        pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_1e8,"X: Failed to decompress MSZIP-compressed data",&local_1e9);
        DeadlyImportError::DeadlyImportError(pDVar12,&local_1e8);
        __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      inflateReset(&stream);
      inflateSetDictionary(&stream,pBVar14,0x8012 - stream.avail_out);
      pBVar14 = pBVar14 + (0x8012 - stream.avail_out);
      puVar10 = (ushort *)(*ppcVar1 + uVar2);
      *ppcVar1 = (char *)puVar10;
    }
    inflateEnd(&stream);
    this->mP = uncompressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    this->mEnd = (char *)pBVar14;
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Successfully decompressed MSZIP-compressed file");
  }
  else {
    ReadUntilEndOfLine(this);
  }
  pSVar11 = (Scene *)operator_new(0x58);
  (pSVar11->mAnims).
  super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar11->mAnims).
  super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar11->mGlobalMaterials).
  super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar11->mAnims).
  super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar11->mGlobalMaterials).
  super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar11->mGlobalMaterials).
  super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar11->mGlobalMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar11->mGlobalMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar11->mRootNode = (Node *)0x0;
  (pSVar11->mGlobalMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pSVar11->mAnimTicksPerSecond = 0;
  this->mScene = pSVar11;
  ParseFile(this);
  pNode = this->mScene->mRootNode;
  if (pNode != (Node *)0x0) {
    FilterHierarchy(this,pNode);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&uncompressed.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

XFileParser::XFileParser( const std::vector<char>& pBuffer)
: mMajorVersion( 0 )
, mMinorVersion( 0 )
, mIsBinaryFormat( false )
, mBinaryNumCount( 0 )
, mP( nullptr )
, mEnd( nullptr )
, mLineNumber( 0 )
, mScene( nullptr ) {
    // vector to store uncompressed file for INFLATE'd X files
    std::vector<char> uncompressed;

    // set up memory pointers
    mP = &pBuffer.front();
    mEnd = mP + pBuffer.size() - 1;

    // check header
    if ( 0 != strncmp( mP, "xof ", 4 ) ) {
        throw DeadlyImportError( "Header mismatch, file is not an XFile." );
    }

    // read version. It comes in a four byte format such as "0302"
    mMajorVersion = (unsigned int)(mP[4] - 48) * 10 + (unsigned int)(mP[5] - 48);
    mMinorVersion = (unsigned int)(mP[6] - 48) * 10 + (unsigned int)(mP[7] - 48);

    bool compressed = false;

    // txt - pure ASCII text format
    if( strncmp( mP + 8, "txt ", 4) == 0)
        mIsBinaryFormat = false;

    // bin - Binary format
    else if( strncmp( mP + 8, "bin ", 4) == 0)
        mIsBinaryFormat = true;

    // tzip - Inflate compressed text format
    else if( strncmp( mP + 8, "tzip", 4) == 0)
    {
        mIsBinaryFormat = false;
        compressed = true;
    }
    // bzip - Inflate compressed binary format
    else if( strncmp( mP + 8, "bzip", 4) == 0)
    {
        mIsBinaryFormat = true;
        compressed = true;
    }
    else ThrowException( format() << "Unsupported xfile format '" <<
       mP[8] << mP[9] << mP[10] << mP[11] << "'");

    // float size
    mBinaryFloatSize = (unsigned int)(mP[12] - 48) * 1000
        + (unsigned int)(mP[13] - 48) * 100
        + (unsigned int)(mP[14] - 48) * 10
        + (unsigned int)(mP[15] - 48);

    if( mBinaryFloatSize != 32 && mBinaryFloatSize != 64)
        ThrowException( format() << "Unknown float size " << mBinaryFloatSize << " specified in xfile header." );

    // The x format specifies size in bits, but we work in bytes
    mBinaryFloatSize /= 8;

    mP += 16;

    // If this is a compressed X file, apply the inflate algorithm to it
    if (compressed)
    {
#ifdef ASSIMP_BUILD_NO_COMPRESSED_X
        throw DeadlyImportError("Assimp was built without compressed X support");
#else
        /* ///////////////////////////////////////////////////////////////////////
         * COMPRESSED X FILE FORMAT
         * ///////////////////////////////////////////////////////////////////////
         *    [xhead]
         *    2 major
         *    2 minor
         *    4 type    // bzip,tzip
         *    [mszip_master_head]
         *    4 unkn    // checksum?
         *    2 unkn    // flags? (seems to be constant)
         *    [mszip_head]
         *    2 ofs     // offset to next section
         *    2 magic   // 'CK'
         *    ... ofs bytes of data
         *    ... next mszip_head
         *
         *  http://www.kdedevelopers.org/node/3181 has been very helpful.
         * ///////////////////////////////////////////////////////////////////////
         */

        // build a zlib stream
        z_stream stream;
        stream.opaque = NULL;
        stream.zalloc = &dummy_alloc;
        stream.zfree  = &dummy_free;
        stream.data_type = (mIsBinaryFormat ? Z_BINARY : Z_ASCII);

        // initialize the inflation algorithm
        ::inflateInit2(&stream, -MAX_WBITS);

        // skip unknown data (checksum, flags?)
        mP += 6;

        // First find out how much storage we'll need. Count sections.
        const char* P1       = mP;
        unsigned int est_out = 0;

        while (P1 + 3 < mEnd)
        {
            // read next offset
            uint16_t ofs = *((uint16_t*)P1);
            AI_SWAP2(ofs); P1 += 2;

            if (ofs >= MSZIP_BLOCK)
                throw DeadlyImportError("X: Invalid offset to next MSZIP compressed block");

            // check magic word
            uint16_t magic = *((uint16_t*)P1);
            AI_SWAP2(magic); P1 += 2;

            if (magic != MSZIP_MAGIC)
                throw DeadlyImportError("X: Unsupported compressed format, expected MSZIP header");

            // and advance to the next offset
            P1 += ofs;
            est_out += MSZIP_BLOCK; // one decompressed block is 32786 in size
        }

        // Allocate storage and terminating zero and do the actual uncompressing
        uncompressed.resize(est_out + 1);
        char* out = &uncompressed.front();
        while (mP + 3 < mEnd)
        {
            uint16_t ofs = *((uint16_t*)mP);
            AI_SWAP2(ofs);
            mP += 4;

            if (mP + ofs > mEnd + 2) {
                throw DeadlyImportError("X: Unexpected EOF in compressed chunk");
            }

            // push data to the stream
            stream.next_in   = (Bytef*)mP;
            stream.avail_in  = ofs;
            stream.next_out  = (Bytef*)out;
            stream.avail_out = MSZIP_BLOCK;

            // and decompress the data ....
            int ret = ::inflate( &stream, Z_SYNC_FLUSH );
            if (ret != Z_OK && ret != Z_STREAM_END)
                throw DeadlyImportError("X: Failed to decompress MSZIP-compressed data");

            ::inflateReset( &stream );
            ::inflateSetDictionary( &stream, (const Bytef*)out , MSZIP_BLOCK - stream.avail_out );

            // and advance to the next offset
            out +=  MSZIP_BLOCK - stream.avail_out;
            mP   += ofs;
        }

        // terminate zlib
        ::inflateEnd(&stream);

        // ok, update pointers to point to the uncompressed file data
        mP = &uncompressed[0];
        mEnd = out;

        // FIXME: we don't need the compressed data anymore, could release
        // it already for better memory usage. Consider breaking const-co.
        ASSIMP_LOG_INFO("Successfully decompressed MSZIP-compressed file");
#endif // !! ASSIMP_BUILD_NO_COMPRESSED_X
    }
    else
    {
        // start reading here
        ReadUntilEndOfLine();
    }

    mScene = new Scene;
    ParseFile();

    // filter the imported hierarchy for some degenerated cases
    if( mScene->mRootNode) {
        FilterHierarchy( mScene->mRootNode);
    }
}